

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O2

int __thiscall
hanabi_learning_env::HanabiGame::NumberCardInstances(HanabiGame *this,int color,int rank)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  iVar2 = 0;
  if ((((-1 < color) && (iVar2 = iVar1, -1 < rank)) && (color < this->num_colors_)) &&
     (rank < this->num_ranks_)) {
    if (rank == 0) {
      return 3;
    }
    iVar2 = (this->num_ranks_ + -1 != rank) + 1;
  }
  return iVar2;
}

Assistant:

int HanabiGame::NumberCardInstances(int color, int rank) const {
  if (color < 0 || color >= NumColors() || rank < 0 || rank >= NumRanks()) {
    return 0;
  }
  if (rank == 0) {
    return 3;
  } else if (rank == NumRanks() - 1) {
    return 1;
  }
  return 2;
}